

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O1

void __thiscall
ear::Channel::Channel
          (Channel *this,string *name,PolarPosition polarPosition,
          optional<ear::PolarPosition> *polarPositionNominal,
          optional<std::pair<double,_double>_> *azimuthRange,
          optional<std::pair<double,_double>_> *elevationRange,bool isLfe)

{
  pointer pcVar1;
  undefined8 uVar2;
  
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  (this->_polarPosition).distance = polarPosition.distance;
  (this->_polarPosition).azimuth = polarPosition.azimuth;
  (this->_polarPosition).elevation = polarPosition.elevation;
  (this->_polarPositionNominal).super_type.m_initialized = false;
  if ((polarPositionNominal->super_type).m_initialized == true) {
    *(undefined8 *)((long)&(this->_polarPositionNominal).super_type.m_storage.dummy_ + 0x10) =
         *(undefined8 *)((long)&(polarPositionNominal->super_type).m_storage.dummy_ + 0x10);
    uVar2 = *(undefined8 *)((long)&(polarPositionNominal->super_type).m_storage.dummy_ + 8);
    (this->_polarPositionNominal).super_type.m_storage.dummy_.aligner_ =
         (polarPositionNominal->super_type).m_storage.dummy_.aligner_;
    *(undefined8 *)((long)&(this->_polarPositionNominal).super_type.m_storage.dummy_ + 8) = uVar2;
    (this->_polarPositionNominal).super_type.m_initialized = true;
  }
  (this->_azimuthRange).super_type.m_initialized = false;
  if ((azimuthRange->super_type).m_initialized == true) {
    uVar2 = *(undefined8 *)((long)&(azimuthRange->super_type).m_storage.dummy_ + 8);
    (this->_azimuthRange).super_type.m_storage.dummy_.aligner_ =
         (azimuthRange->super_type).m_storage.dummy_.aligner_;
    *(undefined8 *)((long)&(this->_azimuthRange).super_type.m_storage.dummy_ + 8) = uVar2;
    (this->_azimuthRange).super_type.m_initialized = true;
  }
  (this->_elevationRange).super_type.m_initialized = false;
  if ((elevationRange->super_type).m_initialized == true) {
    uVar2 = *(undefined8 *)((long)&(elevationRange->super_type).m_storage.dummy_ + 8);
    (this->_elevationRange).super_type.m_storage.dummy_.aligner_ =
         (elevationRange->super_type).m_storage.dummy_.aligner_;
    *(undefined8 *)((long)&(this->_elevationRange).super_type.m_storage.dummy_ + 8) = uVar2;
    (this->_elevationRange).super_type.m_initialized = true;
  }
  this->_isLfe = isLfe;
  return;
}

Assistant:

Channel::Channel(const std::string& name, PolarPosition polarPosition,
                   boost::optional<PolarPosition> polarPositionNominal,
                   boost::optional<std::pair<double, double>> azimuthRange,
                   boost::optional<std::pair<double, double>> elevationRange,
                   bool isLfe)
      : _name(name),
        _polarPosition(polarPosition),
        _polarPositionNominal(polarPositionNominal),
        _azimuthRange(azimuthRange),
        _elevationRange(elevationRange),
        _isLfe(isLfe){}